

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O0

void __thiscall Effects_Buffer::Effects_Buffer(Effects_Buffer *this,bool center_only)

{
  byte in_SIL;
  Multi_Buffer *in_RDI;
  Blip_Buffer *this_00;
  Effects_Buffer *in_stack_ffffffffffffffe0;
  
  Multi_Buffer::Multi_Buffer(in_RDI,2);
  in_RDI->_vptr_Multi_Buffer = (_func_int **)&PTR__Effects_Buffer_00b90c40;
  this_00 = (Blip_Buffer *)(in_RDI + 1);
  do {
    Blip_Buffer::Blip_Buffer(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != (Blip_Buffer *)(in_RDI + 0xf));
  config_t::config_t((config_t *)&in_RDI[0x11].channels_changed_count_);
  blargg_vector<short>::blargg_vector((blargg_vector<short> *)(in_RDI + 0x14));
  blargg_vector<short>::blargg_vector((blargg_vector<short> *)&in_RDI[0x14].sample_rate_);
  in_RDI[0x13].length_ = ((byte)~(in_SIL & 1) & 1) * 4 + 3;
  *(undefined4 *)((long)&in_RDI[0x15]._vptr_Multi_Buffer + 4) = 0;
  *(undefined4 *)&in_RDI[0x15]._vptr_Multi_Buffer = 0;
  *(undefined8 *)&in_RDI[0x13].channels_changed_count_ = 0;
  in_RDI[0x13].sample_rate_ = 0;
  *(undefined1 *)&in_RDI[0x13].samples_per_frame_ = 0;
  set_depth(in_stack_ffffffffffffffe0,(double)this_00);
  return;
}

Assistant:

Effects_Buffer::Effects_Buffer( bool center_only ) : Multi_Buffer( 2 )
{
	buf_count = center_only ? max_buf_count - 4 : max_buf_count;
	
	echo_pos = 0;
	reverb_pos = 0;
	
	stereo_remain = 0;
	effect_remain = 0;
	effects_enabled = false;
	set_depth( 0 );
}